

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::ensureStackUsed(VM *this,addr_t count)

{
  InvalidMemoryAccess *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (count + this->_bp <= this->_sp) {
    return;
  }
  this_00 = (InvalidMemoryAccess *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"tried to modify important stack info",&local_39);
  InvalidMemoryAccess::InvalidMemoryAccess(this_00,&local_38);
  __cxa_throw(this_00,&InvalidMemoryAccess::typeinfo,InvalidMemoryAccess::~InvalidMemoryAccess);
}

Assistant:

void VM::ensureStackUsed(addr_t count) {
    if (_bp + count > _sp) {
        throw InvalidMemoryAccess("tried to modify important stack info");
    }
}